

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

uint64_t __thiscall cmLocalGenerator::GetBackwardsCompatibility(cmLocalGenerator *this)

{
  cmMakefile *this_00;
  int iVar1;
  char *pcVar2;
  allocator<char> local_49;
  string local_48;
  char *local_28;
  char *value;
  uint local_18;
  uint patch;
  uint minor;
  uint major;
  cmLocalGenerator *this_local;
  
  if ((this->BackwardsCompatibilityFinal & 1U) == 0) {
    patch = 0;
    local_18 = 0;
    value._4_4_ = 0;
    this_00 = this->Makefile;
    _minor = this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"CMAKE_BACKWARDS_COMPATIBILITY",&local_49);
    pcVar2 = cmMakefile::GetDefinition(this_00,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    if (pcVar2 != (char *)0x0) {
      local_28 = pcVar2;
      iVar1 = __isoc99_sscanf(pcVar2,"%u.%u.%u",&patch,&local_18,(long)&value + 4);
      if (iVar1 == 1) {
        local_18 = 0;
        value._4_4_ = 0;
      }
      else if (iVar1 == 2) {
        value._4_4_ = 0;
      }
    }
    this->BackwardsCompatibility =
         (ulong)(patch * 1000) * 100000000 + ((ulong)local_18 % 1000) * 100000000 +
         (ulong)value._4_4_ % 100000000;
    this->BackwardsCompatibilityFinal = true;
  }
  return this->BackwardsCompatibility;
}

Assistant:

KWIML_INT_uint64_t cmLocalGenerator::GetBackwardsCompatibility()
{
  // The computed version may change until the project is fully
  // configured.
  if (!this->BackwardsCompatibilityFinal) {
    unsigned int major = 0;
    unsigned int minor = 0;
    unsigned int patch = 0;
    if (const char* value =
          this->Makefile->GetDefinition("CMAKE_BACKWARDS_COMPATIBILITY")) {
      switch (sscanf(value, "%u.%u.%u", &major, &minor, &patch)) {
        case 2:
          patch = 0;
          break;
        case 1:
          minor = 0;
          patch = 0;
          break;
        default:
          break;
      }
    }
    this->BackwardsCompatibility = CMake_VERSION_ENCODE(major, minor, patch);
    this->BackwardsCompatibilityFinal = true;
  }

  return this->BackwardsCompatibility;
}